

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

QAction * __thiscall QToolBar::insertWidget(QToolBar *this,QAction *before,QWidget *widget)

{
  QAction *action;
  
  action = (QAction *)operator_new(0x10);
  QWidgetAction::QWidgetAction((QWidgetAction *)action,(QObject *)this);
  QWidgetAction::setDefaultWidget((QWidgetAction *)action,widget);
  *(byte *)(*(long *)(action + 8) + 0x1d0) = *(byte *)(*(long *)(action + 8) + 0x1d0) | 2;
  QWidget::insertAction(&this->super_QWidget,before,action);
  return action;
}

Assistant:

QAction *QToolBar::insertWidget(QAction *before, QWidget *widget)
{
    QWidgetAction *action = new QWidgetAction(this);
    action->setDefaultWidget(widget);
    action->d_func()->autoCreated = true;
    insertAction(before, action);
    return action;
}